

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_addrinfo * get_localhost(int port,char *name)

{
  int iVar1;
  size_t sVar2;
  Curl_addrinfo *pCVar3;
  Curl_addrinfo *pCVar4;
  ushort uVar5;
  char *__dest;
  Curl_addrinfo *pCVar6;
  uint ipv4;
  uchar ipv6 [16];
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  sVar2 = strlen(name);
  iVar1 = inet_pton(2,"127.0.0.1",&local_5c);
  if ((iVar1 < 1) ||
     (pCVar3 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar2 + 0x41), pCVar3 == (Curl_addrinfo *)0x0)) {
    pCVar3 = (Curl_addrinfo *)0x0;
  }
  else {
    uVar5 = (ushort)port << 8 | (ushort)port >> 8;
    pCVar3->ai_flags = 0;
    pCVar3->ai_family = 2;
    pCVar3->ai_socktype = 1;
    pCVar3->ai_protocol = 6;
    pCVar3->ai_addrlen = 0x10;
    pCVar3->ai_addr = (sockaddr *)(pCVar3 + 1);
    *(undefined2 *)&pCVar3[1].ai_flags = 2;
    *(ushort *)((long)&pCVar3[1].ai_flags + 2) = uVar5;
    pCVar3[1].ai_family = local_5c;
    pCVar3[1].ai_socktype = 0;
    pCVar3[1].ai_protocol = 0;
    pCVar3->ai_canonname = (char *)&pCVar3[1].ai_addrlen;
    strcpy((char *)&pCVar3[1].ai_addrlen,name);
    sVar2 = strlen(name);
    pCVar4 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar2 + 0x4d);
    pCVar6 = (Curl_addrinfo *)0x0;
    if (pCVar4 != (Curl_addrinfo *)0x0) {
      inet_pton(10,"::1",&local_48);
      local_58 = local_48;
      uStack_50 = uStack_40;
      pCVar4->ai_flags = 0;
      pCVar4->ai_family = 10;
      pCVar4->ai_socktype = 1;
      pCVar4->ai_protocol = 6;
      pCVar4->ai_addrlen = 0x1c;
      pCVar4->ai_next = (Curl_addrinfo *)0x0;
      pCVar4->ai_addr = (sockaddr *)(pCVar4 + 1);
      *(undefined2 *)&pCVar4[1].ai_flags = 10;
      *(ushort *)((long)&pCVar4[1].ai_flags + 2) = uVar5;
      pCVar4[1].ai_family = 0;
      pCVar4[1].ai_socktype = (undefined4)local_48;
      pCVar4[1].ai_protocol = local_48._4_4_;
      *(undefined8 *)&pCVar4[1].ai_addrlen = uStack_40;
      *(undefined4 *)&pCVar4[1].ai_canonname = 0;
      __dest = (char *)((long)&pCVar4[1].ai_canonname + 4);
      pCVar4->ai_canonname = __dest;
      strcpy(__dest,name);
      pCVar6 = pCVar4;
    }
    if (pCVar6 != (Curl_addrinfo *)0x0) {
      pCVar6->ai_next = pCVar3;
      pCVar3 = pCVar6;
    }
  }
  return pCVar3;
}

Assistant:

static struct Curl_addrinfo *get_localhost(int port, const char *name)
{
  struct Curl_addrinfo *ca;
  struct Curl_addrinfo *ca6;
  const size_t ss_size = sizeof(struct sockaddr_in);
  const size_t hostlen = strlen(name);
  struct sockaddr_in sa;
  unsigned int ipv4;
  unsigned short port16 = (unsigned short)(port & 0xffff);

  /* memset to clear the sa.sin_zero field */
  memset(&sa, 0, sizeof(sa));
  sa.sin_family = AF_INET;
  sa.sin_port = htons(port16);
  if(Curl_inet_pton(AF_INET, "127.0.0.1", (char *)&ipv4) < 1)
    return NULL;
  memcpy(&sa.sin_addr, &ipv4, sizeof(ipv4));

  ca = calloc(1, sizeof(struct Curl_addrinfo) + ss_size + hostlen + 1);
  if(!ca)
    return NULL;
  ca->ai_flags     = 0;
  ca->ai_family    = AF_INET;
  ca->ai_socktype  = SOCK_STREAM;
  ca->ai_protocol  = IPPROTO_TCP;
  ca->ai_addrlen   = (curl_socklen_t)ss_size;
  ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
  memcpy(ca->ai_addr, &sa, ss_size);
  ca->ai_canonname = (char *)ca->ai_addr + ss_size;
  strcpy(ca->ai_canonname, name);

  ca6 = get_localhost6(port, name);
  if(!ca6)
    return ca;
  ca6->ai_next = ca;
  return ca6;
}